

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O2

parasail_profile_t *
parasail_profile_create_avx_256_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  __m256i *palVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  __m256i *palVar5;
  parasail_profile_t *ppVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  longlong lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  size_t size;
  __m256i_64_t t;
  longlong local_80 [10];
  
  if (matrix == (parasail_matrix_t *)0x0) {
    pcVar8 = "matrix";
  }
  else {
    if (s1 != (char *)0x0 || matrix->type != 0) {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
      }
      uVar2 = matrix->size;
      lVar9 = (long)(int)uVar2;
      uVar4 = (_s1Len + 3) / 4;
      size = (int)uVar4 * lVar9;
      palVar5 = parasail_memalign___m256i(0x20,size);
      if ((palVar5 == (__m256i *)0x0) ||
         (ppVar6 = parasail_profile_new(s1,_s1Len,matrix), ppVar6 == (parasail_profile_t *)0x0)) {
        return (parasail_profile_t *)0x0;
      }
      uVar11 = 0;
      lVar12 = 0;
      do {
        if (uVar11 == (~((int)uVar2 >> 0x1f) & uVar2)) {
          (ppVar6->profile64).score = palVar5;
          ppVar6->free = parasail_free___m256i;
          return ppVar6;
        }
        lVar12 = (long)(int)lVar12;
        lVar16 = 0;
        for (uVar10 = 0; uVar10 != (~((int)uVar4 >> 0x1f) & uVar4); uVar10 = uVar10 + 1) {
          iVar3 = matrix->type;
          lVar15 = lVar16;
          uVar17 = uVar10;
          for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
            if (iVar3 == 0) {
              if ((long)uVar17 < (long)_s1Len) {
                piVar13 = matrix->matrix + uVar11 * lVar9 + (long)matrix->mapper[(byte)s1[uVar17]];
                goto LAB_0074a55f;
              }
LAB_0074a564:
              lVar14 = 0;
            }
            else {
              if ((long)_s1Len <= (long)uVar17) goto LAB_0074a564;
              piVar13 = (int *)((long)matrix->matrix +
                               lVar15 + (long)matrix->mapper[(byte)matrix->alphabet[uVar11]] * 4);
LAB_0074a55f:
              lVar14 = (longlong)*piVar13;
            }
            local_80[lVar7] = lVar14;
            uVar17 = uVar17 + (long)(int)uVar4;
            lVar15 = lVar15 + size * 4;
          }
          palVar1 = palVar5 + lVar12;
          (*palVar1)[0] = local_80[0];
          (*palVar1)[1] = local_80[1];
          (*palVar1)[2] = local_80[2];
          (*palVar1)[3] = local_80[3];
          lVar12 = lVar12 + 1;
          lVar16 = lVar16 + lVar9 * 4;
        }
        uVar11 = uVar11 + 1;
      } while( true );
    }
    pcVar8 = "s1";
  }
  fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_avx_256_64",pcVar8);
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_avx_256_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 4; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_64_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->free = &parasail_free___m256i;
    return profile;
}